

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2icrs.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  CEDate *pCVar2;
  CESkyCoord output;
  CESkyCoord input;
  CEExecOptions opts;
  CEExecOptions *in_stack_fffffffffffffb40;
  CLOptions *in_stack_fffffffffffffb48;
  CLOptions *this;
  undefined1 local_471 [33];
  CEObserver local_450 [183];
  allocator local_399;
  string local_398 [32];
  CEDate local_378 [64];
  CEDate local_338 [48];
  CESkyCoordType local_308;
  allocator local_301;
  string local_300 [32];
  double local_2e0;
  CEAngle local_2d8 [23];
  allocator local_2c1;
  string local_2c0 [32];
  double local_2a0;
  CEAngle local_298 [16];
  CESkyCoord local_288 [48];
  uint local_258;
  double in_stack_fffffffffffffe10;
  CESkyCoord *in_stack_fffffffffffffe18;
  CESkyCoord *in_stack_fffffffffffffe20;
  char **in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  CLOptions *in_stack_fffffffffffffe48;
  
  DefineOpts();
  bVar1 = CLOptions::ParseCommandLine
                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe38);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"ra",&local_2c1);
    local_2a0 = CLOptions::AsDouble(in_stack_fffffffffffffb48,(string *)in_stack_fffffffffffffb40);
    CEAngle::Deg((double *)local_298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_300,"dec",&local_301);
    local_2e0 = CLOptions::AsDouble(in_stack_fffffffffffffb48,(string *)in_stack_fffffffffffffb40);
    CEAngle::Deg((double *)local_2d8);
    local_308 = CIRS;
    CESkyCoord::CESkyCoord(local_288,local_298,local_2d8,&local_308);
    CEAngle::~CEAngle(local_2d8);
    std::__cxx11::string::~string(local_300);
    std::allocator<char>::~allocator((allocator<char> *)&local_301);
    CEAngle::~CEAngle(local_298);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_398,"juliandate",&local_399);
    pCVar2 = (CEDate *)
             CLOptions::AsDouble(in_stack_fffffffffffffb48,(string *)in_stack_fffffffffffffb40);
    CEDate::CEDate(pCVar2,local_378,0);
    CEObserver::CEObserver(local_450);
    CESkyCoord::ConvertToICRS(local_338,(CEObserver *)local_288);
    CEObserver::~CEObserver(local_450);
    CEDate::~CEDate(local_378);
    std::__cxx11::string::~string(local_398);
    std::allocator<char>::~allocator((allocator<char> *)&local_399);
    this = (CLOptions *)local_471;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_471 + 1),"juliandate",(allocator *)this);
    in_stack_fffffffffffffb40 =
         (CEExecOptions *)CLOptions::AsDouble(this,(string *)in_stack_fffffffffffffb40);
    PrintResults(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    std::__cxx11::string::~string((string *)(local_471 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_471);
    CESkyCoord::~CESkyCoord((CESkyCoord *)local_338);
    CESkyCoord::~CESkyCoord(local_288);
  }
  local_258 = (uint)bVar1;
  CEExecOptions::~CEExecOptions(in_stack_fffffffffffffb40);
  return 0;
}

Assistant:

int main (int argc, char** argv)
{
    // Get the options from the command line
    CEExecOptions opts = DefineOpts() ;
    if (opts.ParseCommandLine(argc, argv)) return 0 ;
    
    // Create a CECoordinates object
    CESkyCoord input(CEAngle::Deg(opts.AsDouble("ra")), 
                     CEAngle::Deg(opts.AsDouble("dec")),
                     CESkyCoordType::CIRS) ;
    
    // Get the coordinates as CIRS
    CESkyCoord output = input.ConvertToICRS(opts.AsDouble("juliandate")) ;
    
    // Print the result
    PrintResults(input, output, opts.AsDouble("juliandate")) ;
}